

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O0

int __thiscall CPU::instrBIT0x2c(CPU *this)

{
  uint8_t argument;
  CPU *in_RDI;
  
  argument = absolute_addr(in_RDI);
  BIT(in_RDI,argument);
  return 4;
}

Assistant:

int CPU::instrBIT0x2c() {
	BIT(absolute_addr());
	return 4;
}